

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGen_X86.cpp
# Opt level: O1

void EMIT_OP_REG_REG(CodeGenGenericContext *ctx,x86Command op,x86Reg reg1,x86XmmReg reg2)

{
  x86Instruction *pxVar1;
  undefined4 uStack_3c;
  undefined4 uStack_34;
  
  if (op == o_movd) {
    if (ctx->xmmReg[reg2].type == argXmmReg) {
      reg2 = ctx->xmmReg[reg2].field_1.reg;
    }
    ctx->xmmRegRead[reg2] = true;
    CodeGenGenericContext::OverwriteRegisterWithValue
              (ctx,reg1,(x86Argument)
                        ZEXT1632(CONCAT88(CONCAT44(uStack_34,reg2),CONCAT44(uStack_3c,3))));
    pxVar1 = ctx->x86Op;
    pxVar1->name = o_movd;
    (pxVar1->argA).type = argReg;
    (pxVar1->argA).field_1.reg = reg1;
    pxVar1 = ctx->x86Op;
    (pxVar1->argB).type = argXmmReg;
    (pxVar1->argB).field_1.xmmArg = reg2;
    ctx->x86Op = ctx->x86Op + 1;
    return;
  }
  __assert_fail("!\"unknown instruction\"",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/CodeGen_X86.cpp"
                ,0x59b,
                "void EMIT_OP_REG_REG(CodeGenGenericContext &, x86Command, x86Reg, x86XmmReg)");
}

Assistant:

void EMIT_OP_REG_REG(CodeGenGenericContext &ctx, x86Command op, x86Reg reg1, x86XmmReg reg2)
{
#ifdef NULLC_OPTIMIZE_X86
	switch(op)
	{
	case o_movd:
		reg2 = ctx.RedirectRegister(reg2);

		ctx.ReadRegister(reg2);
		ctx.OverwriteRegisterWithValue(reg1, x86Argument(reg2));
		break;
	default:
		assert(!"unknown instruction");
	}
#endif

	ctx.x86Op->name = op;
	ctx.x86Op->argA.type = x86Argument::argReg;
	ctx.x86Op->argA.reg = reg1;
	ctx.x86Op->argB.type = x86Argument::argXmmReg;
	ctx.x86Op->argB.xmmArg = reg2;
	ctx.x86Op++;
}